

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

string * __thiscall
mp::NLModel::WriteNL
          (NLModel *this,string *fln,NLW2_NLOptionsBasic_C opts,NLUtils *ut,PreprocessData *pd)

{
  NLW2_NLOptionsBasic_C opts_00;
  undefined8 in_RCX;
  NLFeeder_Easy *in_RDI;
  int in_R8D;
  NLFeeder_Easy nlf;
  NLUtils *in_stack_000003d8;
  NLFeeder_Easy *in_stack_000003e0;
  string *in_stack_000003e8;
  NLFeeder_Easy *this_00;
  PreprocessData *in_stack_fffffffffffffca8;
  NLFeeder_Easy *in_stack_fffffffffffffcb0;
  NLModel *in_stack_fffffffffffffcc8;
  NLFeeder_Easy *in_stack_fffffffffffffcd0;
  
  opts_00.flags_ = in_R8D;
  opts_00._0_8_ = in_RCX;
  this_00 = in_RDI;
  NLFeeder_Easy::NLFeeder_Easy(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,opts_00);
  NLFeeder_Easy::ExportPreproData(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  WriteNLFile<mp::NLFeeder_Easy>(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
  std::__cxx11::string::string((string *)in_RDI,(string *)&stack0xfffffffffffffca8);
  std::
  pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x1288c4);
  NLFeeder_Easy::~NLFeeder_Easy(this_00);
  return (string *)this_00;
}

Assistant:

std::string NLModel::WriteNL(
    const std::string &fln, NLW2_NLOptionsBasic_C opts,
    NLUtils &ut, PreprocessData &pd) {
  NLFeeder_Easy nlf(*this, opts);
  nlf.ExportPreproData(pd);
  return WriteNLFile(fln, nlf, ut).second;
}